

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O2

void __thiscall klogic::mlmvn::dump(mlmvn *this)

{
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  pointer pvVar6;
  
  uVar5 = 0;
  while( true ) {
    pvVar6 = (this->neurons).
             super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->neurons).
                       super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6) / 0x18) <= uVar5)
    break;
    pvVar6 = pvVar6 + uVar5;
    uVar5 = uVar5 + 1;
    lVar4 = 0;
    uVar3 = 0;
    while (uVar3 < (ulong)((long)*(pointer *)
                                  ((long)&(pvVar6->
                                          super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>
                                          )._M_impl + 8) -
                           *(long *)&(pvVar6->
                                     super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>).
                                     _M_impl >> 5)) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"MVN[");
      uVar3 = uVar3 + 1;
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar3);
      poVar1 = std::operator<<(poVar1,',');
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar5);
      poVar1 = std::operator<<(poVar1,"]: ");
      pbVar2 = operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar1,
                          (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          (*(long *)&(pvVar6->
                                     super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>).
                                     _M_impl + lVar4));
      std::endl<char,std::char_traits<char>>((ostream *)pbVar2);
      lVar4 = lVar4 + 0x20;
    }
  }
  return;
}

Assistant:

void klogic::mlmvn::dump() const
{
    for (int layer = 0; layer < layers_count(); ++layer) {
        const vector<mvn> &layer_neurons = neurons[layer];

        for (int k = 0; k < layer_neurons.size(); ++k) {
            std::cerr << "MVN[" << (k+1) << ',' << (layer+1) << "]: " << layer_neurons[k].weights_vector() << std::endl;
        }
    }
}